

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_regex.cpp
# Opt level: O0

Language * Omega_h::regex::build_language(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  reference pvVar1;
  reference pvVar2;
  Language *in_RDI;
  string *local_17c0;
  string *local_1758;
  string *local_1710;
  string *local_16c8;
  string *local_1670;
  string *local_1628;
  string *local_15b0;
  string *local_1548;
  string *local_1500;
  string *local_14b8;
  string *local_1450;
  string *local_1408;
  string *local_13c0;
  string *local_1378;
  string *local_1320;
  string *local_12c8;
  string *local_1270;
  string *local_1228;
  string *local_11d0;
  string *local_1188;
  string *local_1120;
  string *local_10d8;
  allocator local_108a;
  allocator local_1089;
  Token local_1088;
  undefined1 local_1043;
  allocator local_1042;
  allocator local_1041;
  Token local_1040;
  undefined1 local_ffb;
  allocator local_ffa;
  allocator local_ff9;
  Token local_ff8;
  undefined1 local_fb3;
  allocator local_fb2;
  allocator local_fb1;
  Token local_fb0;
  undefined1 local_f6b;
  allocator local_f6a;
  allocator local_f69;
  Token local_f68;
  undefined1 local_f23;
  allocator local_f22;
  allocator local_f21;
  Token local_f20;
  undefined1 local_edb;
  allocator local_eda;
  allocator local_ed9;
  Token local_ed8;
  undefined1 local_e93;
  allocator local_e92;
  allocator local_e91;
  Token local_e90;
  undefined1 local_e4b;
  allocator local_e4a;
  allocator local_e49;
  Token local_e48;
  undefined1 local_e03;
  allocator local_e02;
  allocator local_e01;
  Token local_e00;
  undefined1 local_dbb;
  allocator local_dba;
  allocator local_db9;
  Token local_db8;
  undefined1 local_d73;
  allocator local_d72;
  allocator local_d71;
  Token local_d70;
  undefined1 local_d2e;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d2d;
  undefined1 local_d2c;
  allocator local_d2b;
  allocator local_d2a;
  allocator local_d29;
  string *local_d28;
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  iterator local_cc0;
  size_type local_cb8;
  allocator local_ca9;
  Production local_ca8;
  undefined1 local_c6c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c6b;
  undefined1 local_c6a;
  allocator local_c69;
  string *local_c68;
  string local_c60 [32];
  iterator local_c40;
  size_type local_c38;
  allocator local_c29;
  Production local_c28;
  undefined1 local_bec;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_beb;
  undefined1 local_bea;
  allocator local_be9;
  string *local_be8;
  string local_be0 [32];
  iterator local_bc0;
  size_type local_bb8;
  allocator local_ba9;
  Production local_ba8;
  undefined1 local_b6d;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b6c;
  undefined1 local_b6b;
  allocator local_b6a;
  allocator local_b69;
  string *local_b68;
  string local_b60 [32];
  string local_b40 [32];
  iterator local_b20;
  size_type local_b18;
  allocator local_b09;
  Production local_b08;
  undefined1 local_acc;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_acb;
  undefined1 local_aca;
  allocator local_ac9;
  string *local_ac8;
  string local_ac0 [32];
  iterator local_aa0;
  size_type local_a98;
  allocator local_a89;
  Production local_a88;
  undefined1 local_a4f;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a4e;
  undefined1 local_a4d;
  allocator local_a4c;
  allocator local_a4b;
  allocator local_a4a;
  allocator local_a49;
  string *local_a48;
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  iterator local_9c0;
  size_type local_9b8;
  allocator local_9a9;
  Production local_9a8;
  undefined1 local_96e;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_96d;
  undefined1 local_96c;
  allocator local_96b;
  allocator local_96a;
  allocator local_969;
  string *local_968;
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  iterator local_900;
  size_type local_8f8;
  allocator local_8e9;
  Production local_8e8;
  undefined1 local_8ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8ab;
  undefined1 local_8aa;
  allocator local_8a9;
  string *local_8a8;
  string local_8a0 [32];
  iterator local_880;
  size_type local_878;
  allocator local_869;
  Production local_868;
  undefined1 local_82c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_82b;
  undefined1 local_82a;
  allocator local_829;
  string *local_828;
  string local_820 [32];
  iterator local_800;
  size_type local_7f8;
  allocator local_7e9;
  Production local_7e8;
  undefined1 local_7ae;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7ad;
  undefined1 local_7ac;
  allocator local_7ab;
  allocator local_7aa;
  allocator local_7a9;
  string *local_7a8;
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  iterator local_740;
  size_type local_738;
  allocator local_729;
  Production local_728;
  undefined1 local_6ec;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6eb;
  undefined1 local_6ea;
  allocator local_6e9;
  string *local_6e8;
  string local_6e0 [32];
  iterator local_6c0;
  size_type local_6b8;
  allocator local_6a9;
  Production local_6a8;
  undefined1 local_66c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_66b;
  undefined1 local_66a;
  allocator local_669;
  string *local_668;
  string local_660 [32];
  iterator local_640;
  size_type local_638;
  allocator local_629;
  Production local_628;
  undefined1 local_5ec;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5eb;
  undefined1 local_5ea;
  allocator local_5e9;
  string *local_5e8;
  string local_5e0 [32];
  iterator local_5c0;
  size_type local_5b8;
  allocator local_5a9;
  Production local_5a8;
  undefined1 local_56d;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_56c;
  undefined1 local_56b;
  allocator local_56a;
  allocator local_569;
  string *local_568;
  string local_560 [32];
  string local_540 [32];
  iterator local_520;
  size_type local_518;
  allocator local_509;
  Production local_508;
  undefined1 local_4cd;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4cc;
  undefined1 local_4cb;
  allocator local_4ca;
  allocator local_4c9;
  string *local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  iterator local_480;
  size_type local_478;
  allocator local_469;
  Production local_468;
  undefined1 local_42d;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_42c;
  undefined1 local_42b;
  allocator local_42a;
  allocator local_429;
  string *local_428;
  string local_420 [32];
  string local_400 [32];
  iterator local_3e0;
  size_type local_3d8;
  allocator local_3c9;
  Production local_3c8;
  undefined1 local_38c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38b;
  undefined1 local_38a;
  allocator local_389;
  string *local_388;
  string local_380 [32];
  iterator local_360;
  size_type local_358;
  allocator local_349;
  Production local_348;
  undefined1 local_30d;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30c;
  undefined1 local_30b;
  allocator local_30a;
  allocator local_309;
  string *local_308;
  string local_300 [32];
  string local_2e0 [32];
  iterator local_2c0;
  size_type local_2b8;
  allocator local_2a9;
  Production local_2a8;
  undefined1 local_26c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26b;
  undefined1 local_26a;
  allocator local_269;
  string *local_268;
  string local_260 [32];
  iterator local_240;
  size_type local_238;
  allocator local_229;
  Production local_228;
  undefined1 local_1ee;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ed;
  undefined1 local_1ec;
  allocator local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  string *local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  iterator local_180;
  size_type local_178;
  allocator local_169;
  Production local_168;
  undefined1 local_12c;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12b;
  undefined1 local_12a;
  allocator local_129;
  string *local_128;
  string local_120 [32];
  iterator local_100;
  size_type local_f8;
  allocator local_e9;
  Production local_e8;
  undefined1 local_ac;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ab;
  undefined1 local_aa;
  allocator local_a9;
  string *local_a8;
  string local_a0 [32];
  iterator local_80;
  size_type local_78;
  allocator local_69;
  Production local_68;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *local_20;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *prods;
  Language *out;
  
  prods._7_1_ = 0;
  Language::Language(in_RDI);
  local_20 = &in_RDI->productions;
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (local_20,0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"regex",&local_69);
  local_ac = 1;
  local_aa = 1;
  local_a8 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"union",&local_a9);
  local_aa = 0;
  local_80 = (iterator)local_a0;
  local_78 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_ab);
  __l_20._M_len = local_78;
  __l_20._M_array = local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68.rhs,__l_20,&local_ab);
  local_ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0);
  Language::Production::operator=(pvVar1,&local_68);
  Language::Production::~Production(&local_68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_ab);
  local_10d8 = (string *)&local_80;
  do {
    local_10d8 = local_10d8 + -0x20;
    std::__cxx11::string::~string(local_10d8);
  } while (local_10d8 != local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"union",&local_e9);
  local_12c = 1;
  local_12a = 1;
  local_128 = local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"concat",&local_129);
  local_12a = 0;
  local_100 = (iterator)local_120;
  local_f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_12b);
  __l_19._M_len = local_f8;
  __l_19._M_array = local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8.rhs,__l_19,&local_12b);
  local_12c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,1);
  Language::Production::operator=(pvVar1,&local_e8);
  Language::Production::~Production(&local_e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_12b);
  local_1120 = (string *)&local_100;
  do {
    local_1120 = local_1120 + -0x20;
    std::__cxx11::string::~string(local_1120);
  } while (local_1120 != local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"union",&local_169);
  local_1ee = 1;
  local_1ec = 1;
  local_1e8 = local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"union",&local_1e9);
  local_1e8 = local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"|",&local_1ea);
  local_1e8 = local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"concat",&local_1eb);
  local_1ec = 0;
  local_180 = (iterator)local_1e0;
  local_178 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1ed);
  __l_18._M_len = local_178;
  __l_18._M_array = local_180;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168.rhs,__l_18,&local_1ed);
  local_1ee = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,2);
  Language::Production::operator=(pvVar1,&local_168);
  Language::Production::~Production(&local_168);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1ed);
  local_1188 = (string *)&local_180;
  do {
    local_1188 = local_1188 + -0x20;
    std::__cxx11::string::~string(local_1188);
  } while (local_1188 != local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ea);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"concat",&local_229);
  local_26c = 1;
  local_26a = 1;
  local_268 = local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"qualified",&local_269);
  local_26a = 0;
  local_240 = (iterator)local_260;
  local_238 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_26b);
  __l_17._M_len = local_238;
  __l_17._M_array = local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228.rhs,__l_17,&local_26b);
  local_26c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,3);
  Language::Production::operator=(pvVar1,&local_228);
  Language::Production::~Production(&local_228);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_26b);
  local_11d0 = (string *)&local_240;
  do {
    local_11d0 = local_11d0 + -0x20;
    std::__cxx11::string::~string(local_11d0);
  } while (local_11d0 != local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"concat",&local_2a9);
  local_30d = 1;
  local_30b = 1;
  local_308 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"concat",&local_309);
  local_308 = local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"qualified",&local_30a);
  local_30b = 0;
  local_2c0 = (iterator)local_300;
  local_2b8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_30c);
  __l_16._M_len = local_2b8;
  __l_16._M_array = local_2c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a8.rhs,__l_16,&local_30c);
  local_30d = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,4);
  Language::Production::operator=(pvVar1,&local_2a8);
  Language::Production::~Production(&local_2a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_30c);
  local_1228 = (string *)&local_2c0;
  do {
    local_1228 = local_1228 + -0x20;
    std::__cxx11::string::~string(local_1228);
  } while (local_1228 != local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_30a);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"qualified",&local_349);
  local_38c = 1;
  local_38a = 1;
  local_388 = local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"single",&local_389);
  local_38a = 0;
  local_360 = (iterator)local_380;
  local_358 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_38b);
  __l_15._M_len = local_358;
  __l_15._M_array = local_360;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_348.rhs,__l_15,&local_38b);
  local_38c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,5);
  Language::Production::operator=(pvVar1,&local_348);
  Language::Production::~Production(&local_348);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_38b);
  local_1270 = (string *)&local_360;
  do {
    local_1270 = local_1270 + -0x20;
    std::__cxx11::string::~string(local_1270);
  } while (local_1270 != local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"qualified",&local_3c9);
  local_42d = 1;
  local_42b = 1;
  local_428 = local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"qualified",&local_429);
  local_428 = local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"*",&local_42a);
  local_42b = 0;
  local_3e0 = (iterator)local_420;
  local_3d8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_42c);
  __l_14._M_len = local_3d8;
  __l_14._M_array = local_3e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3c8.rhs,__l_14,&local_42c);
  local_42d = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,6);
  Language::Production::operator=(pvVar1,&local_3c8);
  Language::Production::~Production(&local_3c8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_42c);
  local_12c8 = (string *)&local_3e0;
  do {
    local_12c8 = local_12c8 + -0x20;
    std::__cxx11::string::~string(local_12c8);
  } while (local_12c8 != local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_42a);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"qualified",&local_469);
  local_4cd = 1;
  local_4cb = 1;
  local_4c8 = local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"qualified",&local_4c9);
  local_4c8 = local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"+",&local_4ca);
  local_4cb = 0;
  local_480 = (iterator)local_4c0;
  local_478 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_4cc);
  __l_13._M_len = local_478;
  __l_13._M_array = local_480;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_468.rhs,__l_13,&local_4cc);
  local_4cd = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,7);
  Language::Production::operator=(pvVar1,&local_468);
  Language::Production::~Production(&local_468);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_4cc);
  local_1320 = (string *)&local_480;
  do {
    local_1320 = local_1320 + -0x20;
    std::__cxx11::string::~string(local_1320);
  } while (local_1320 != local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4ca);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"qualified",&local_509);
  local_56d = 1;
  local_56b = 1;
  local_568 = local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"qualified",&local_569);
  local_568 = local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"?",&local_56a);
  local_56b = 0;
  local_520 = (iterator)local_560;
  local_518 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_56c);
  __l_12._M_len = local_518;
  __l_12._M_array = local_520;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_508.rhs,__l_12,&local_56c);
  local_56d = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,8);
  Language::Production::operator=(pvVar1,&local_508);
  Language::Production::~Production(&local_508);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_56c);
  local_1378 = (string *)&local_520;
  do {
    local_1378 = local_1378 + -0x20;
    std::__cxx11::string::~string(local_1378);
  } while (local_1378 != local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_56a);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"single",&local_5a9);
  local_5ec = 1;
  local_5ea = 1;
  local_5e8 = local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"char",&local_5e9);
  local_5ea = 0;
  local_5c0 = (iterator)local_5e0;
  local_5b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5eb);
  __l_11._M_len = local_5b8;
  __l_11._M_array = local_5c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5a8.rhs,__l_11,&local_5eb);
  local_5ec = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,9);
  Language::Production::operator=(pvVar1,&local_5a8);
  Language::Production::~Production(&local_5a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5eb);
  local_13c0 = (string *)&local_5c0;
  do {
    local_13c0 = local_13c0 + -0x20;
    std::__cxx11::string::~string(local_13c0);
  } while (local_13c0 != local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"single",&local_629);
  local_66c = 1;
  local_66a = 1;
  local_668 = local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,".",&local_669);
  local_66a = 0;
  local_640 = (iterator)local_660;
  local_638 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_66b);
  __l_10._M_len = local_638;
  __l_10._M_array = local_640;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_628.rhs,__l_10,&local_66b);
  local_66c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,10);
  Language::Production::operator=(pvVar1,&local_628);
  Language::Production::~Production(&local_628);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_66b);
  local_1408 = (string *)&local_640;
  do {
    local_1408 = local_1408 + -0x20;
    std::__cxx11::string::~string(local_1408);
  } while (local_1408 != local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"single",&local_6a9);
  local_6ec = 1;
  local_6ea = 1;
  local_6e8 = local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"set",&local_6e9);
  local_6ea = 0;
  local_6c0 = (iterator)local_6e0;
  local_6b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6eb);
  __l_09._M_len = local_6b8;
  __l_09._M_array = local_6c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6a8.rhs,__l_09,&local_6eb);
  local_6ec = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xb);
  Language::Production::operator=(pvVar1,&local_6a8);
  Language::Production::~Production(&local_6a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6eb);
  local_1450 = (string *)&local_6c0;
  do {
    local_1450 = local_1450 + -0x20;
    std::__cxx11::string::~string(local_1450);
  } while (local_1450 != local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_728,"single",&local_729);
  local_7ae = 1;
  local_7ac = 1;
  local_7a8 = local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"(",&local_7a9);
  local_7a8 = local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"union",&local_7aa);
  local_7a8 = local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,")",&local_7ab);
  local_7ac = 0;
  local_740 = (iterator)local_7a0;
  local_738 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7ad);
  __l_08._M_len = local_738;
  __l_08._M_array = local_740;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_728.rhs,__l_08,&local_7ad);
  local_7ae = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xc);
  Language::Production::operator=(pvVar1,&local_728);
  Language::Production::~Production(&local_728);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7ad);
  local_14b8 = (string *)&local_740;
  do {
    local_14b8 = local_14b8 + -0x20;
    std::__cxx11::string::~string(local_14b8);
  } while (local_14b8 != local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7ab);
  std::allocator<char>::~allocator((allocator<char> *)&local_7aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"set",&local_7e9);
  local_82c = 1;
  local_82a = 1;
  local_828 = local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"positive-set",&local_829);
  local_82a = 0;
  local_800 = (iterator)local_820;
  local_7f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_82b);
  __l_07._M_len = local_7f8;
  __l_07._M_array = local_800;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_7e8.rhs,__l_07,&local_82b);
  local_82c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xd);
  Language::Production::operator=(pvVar1,&local_7e8);
  Language::Production::~Production(&local_7e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_82b);
  local_1500 = (string *)&local_800;
  do {
    local_1500 = local_1500 + -0x20;
    std::__cxx11::string::~string(local_1500);
  } while (local_1500 != local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_829);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_868,"set",&local_869);
  local_8ac = 1;
  local_8aa = 1;
  local_8a8 = local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"negative-set",&local_8a9);
  local_8aa = 0;
  local_880 = (iterator)local_8a0;
  local_878 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8ab);
  __l_06._M_len = local_878;
  __l_06._M_array = local_880;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_868.rhs,__l_06,&local_8ab);
  local_8ac = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xe);
  Language::Production::operator=(pvVar1,&local_868);
  Language::Production::~Production(&local_868);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8ab);
  local_1548 = (string *)&local_880;
  do {
    local_1548 = local_1548 + -0x20;
    std::__cxx11::string::~string(local_1548);
  } while (local_1548 != local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"positive-set",&local_8e9);
  local_96e = 1;
  local_96c = 1;
  local_968 = local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_960,"[",&local_969);
  local_968 = local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"set-items",&local_96a);
  local_968 = local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"]",&local_96b);
  local_96c = 0;
  local_900 = (iterator)local_960;
  local_8f8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_96d);
  __l_05._M_len = local_8f8;
  __l_05._M_array = local_900;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_8e8.rhs,__l_05,&local_96d);
  local_96e = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0xf);
  Language::Production::operator=(pvVar1,&local_8e8);
  Language::Production::~Production(&local_8e8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_96d);
  local_15b0 = (string *)&local_900;
  do {
    local_15b0 = local_15b0 + -0x20;
    std::__cxx11::string::~string(local_15b0);
  } while (local_15b0 != local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_96b);
  std::allocator<char>::~allocator((allocator<char> *)&local_96a);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a8,"negative-set",&local_9a9);
  local_a4f = 1;
  local_a4d = 1;
  local_a48 = local_a40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a40,"[",&local_a49);
  local_a48 = local_a20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a20,"^",&local_a4a);
  local_a48 = local_a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a00,"set-items",&local_a4b);
  local_a48 = local_9e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"]",&local_a4c);
  local_a4d = 0;
  local_9c0 = (iterator)local_a40;
  local_9b8 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_a4e);
  __l_04._M_len = local_9b8;
  __l_04._M_array = local_9c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_9a8.rhs,__l_04,&local_a4e);
  local_a4f = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x10);
  Language::Production::operator=(pvVar1,&local_9a8);
  Language::Production::~Production(&local_9a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a4e);
  local_1628 = (string *)&local_9c0;
  do {
    local_1628 = local_1628 + -0x20;
    std::__cxx11::string::~string(local_1628);
  } while (local_1628 != local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a4c);
  std::allocator<char>::~allocator((allocator<char> *)&local_a4b);
  std::allocator<char>::~allocator((allocator<char> *)&local_a4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a88,"set-items",&local_a89);
  local_acc = 1;
  local_aca = 1;
  local_ac8 = local_ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"set-item",&local_ac9);
  local_aca = 0;
  local_aa0 = (iterator)local_ac0;
  local_a98 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_acb);
  __l_03._M_len = local_a98;
  __l_03._M_array = local_aa0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a88.rhs,__l_03,&local_acb);
  local_acc = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x11);
  Language::Production::operator=(pvVar1,&local_a88);
  Language::Production::~Production(&local_a88);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_acb);
  local_1670 = (string *)&local_aa0;
  do {
    local_1670 = local_1670 + -0x20;
    std::__cxx11::string::~string(local_1670);
  } while (local_1670 != local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b08,"set-items",&local_b09);
  local_b6d = 1;
  local_b6b = 1;
  local_b68 = local_b60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"set-items",&local_b69);
  local_b68 = local_b40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"set-item",&local_b6a);
  local_b6b = 0;
  local_b20 = (iterator)local_b60;
  local_b18 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_b6c);
  __l_02._M_len = local_b18;
  __l_02._M_array = local_b20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b08.rhs,__l_02,&local_b6c);
  local_b6d = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x12);
  Language::Production::operator=(pvVar1,&local_b08);
  Language::Production::~Production(&local_b08);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_b6c);
  local_16c8 = (string *)&local_b20;
  do {
    local_16c8 = local_16c8 + -0x20;
    std::__cxx11::string::~string(local_16c8);
  } while (local_16c8 != local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b6a);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ba8,"set-item",&local_ba9);
  local_bec = 1;
  local_bea = 1;
  local_be8 = local_be0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be0,"char",&local_be9);
  local_bea = 0;
  local_bc0 = (iterator)local_be0;
  local_bb8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_beb);
  __l_01._M_len = local_bb8;
  __l_01._M_array = local_bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_ba8.rhs,__l_01,&local_beb);
  local_bec = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x13);
  Language::Production::operator=(pvVar1,&local_ba8);
  Language::Production::~Production(&local_ba8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_beb);
  local_1710 = (string *)&local_bc0;
  do {
    local_1710 = local_1710 + -0x20;
    std::__cxx11::string::~string(local_1710);
  } while (local_1710 != local_be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c28,"set-item",&local_c29);
  local_c6c = 1;
  local_c6a = 1;
  local_c68 = local_c60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c60,"range",&local_c69);
  local_c6a = 0;
  local_c40 = (iterator)local_c60;
  local_c38 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_c6b);
  __l_00._M_len = local_c38;
  __l_00._M_array = local_c40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c28.rhs,__l_00,&local_c6b);
  local_c6c = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x14);
  Language::Production::operator=(pvVar1,&local_c28);
  Language::Production::~Production(&local_c28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_c6b);
  local_1758 = (string *)&local_c40;
  do {
    local_1758 = local_1758 + -0x20;
    std::__cxx11::string::~string(local_1758);
  } while (local_1758 != local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::allocator<char>::~allocator((allocator<char> *)&local_c29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ca8,"range",&local_ca9);
  local_d2e = 1;
  local_d2c = 1;
  local_d28 = local_d20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"char",&local_d29);
  local_d28 = local_d00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d00,"-",&local_d2a);
  local_d28 = local_ce0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"char",&local_d2b);
  local_d2c = 0;
  local_cc0 = (iterator)local_d20;
  local_cb8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_d2d);
  __l._M_len = local_cb8;
  __l._M_array = local_cc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_ca8.rhs,__l,&local_d2d);
  local_d2e = 0;
  pvVar1 = std::
           vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
           operator[](local_20,0x15);
  Language::Production::operator=(pvVar1,&local_ca8);
  Language::Production::~Production(&local_ca8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_d2d);
  local_17c0 = (string *)&local_cc0;
  do {
    local_17c0 = local_17c0 + -0x20;
    std::__cxx11::string::~string(local_17c0);
  } while (local_17c0 != local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d2b);
  std::allocator<char>::~allocator((allocator<char> *)&local_d2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_d29);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d70,"char",&local_d71);
  local_d73 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d70.regex,"[^\\\\\\.\\[\\]\\(\\)\\|\\-\\^\\*\\+\\?]|\\\\.",&local_d72)
  ;
  local_d73 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0);
  Language::Token::operator=(pvVar2,&local_d70);
  Language::Token::~Token(&local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d72);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_db8,".",&local_db9);
  local_dbb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_db8.regex,"\\.",&local_dba);
  local_dbb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,1);
  Language::Token::operator=(pvVar2,&local_db8);
  Language::Token::~Token(&local_db8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dba);
  std::allocator<char>::~allocator((allocator<char> *)&local_db9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e00,"[",&local_e01);
  local_e03 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e00.regex,"\\]",&local_e02);
  local_e03 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,2);
  Language::Token::operator=(pvVar2,&local_e00);
  Language::Token::~Token(&local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e02);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e48,"]",&local_e49);
  local_e4b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e48.regex,"\\]",&local_e4a);
  local_e4b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,3);
  Language::Token::operator=(pvVar2,&local_e48);
  Language::Token::~Token(&local_e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_e4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_e49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e90,"(",&local_e91);
  local_e93 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e90.regex,"\\(",&local_e92);
  local_e93 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,4);
  Language::Token::operator=(pvVar2,&local_e90);
  Language::Token::~Token(&local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e92);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ed8,")",&local_ed9);
  local_edb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ed8.regex,"\\)",&local_eda);
  local_edb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,5);
  Language::Token::operator=(pvVar2,&local_ed8);
  Language::Token::~Token(&local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eda);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f20,"|",&local_f21);
  local_f23 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f20.regex,"\\|",&local_f22);
  local_f23 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,6);
  Language::Token::operator=(pvVar2,&local_f20);
  Language::Token::~Token(&local_f20);
  std::allocator<char>::~allocator((allocator<char> *)&local_f22);
  std::allocator<char>::~allocator((allocator<char> *)&local_f21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f68,"-",&local_f69);
  local_f6b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f68.regex,"\\-",&local_f6a);
  local_f6b = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,7);
  Language::Token::operator=(pvVar2,&local_f68);
  Language::Token::~Token(&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f6a);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fb0,"^",&local_fb1);
  local_fb3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fb0.regex,"\\^",&local_fb2);
  local_fb3 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,8);
  Language::Token::operator=(pvVar2,&local_fb0);
  Language::Token::~Token(&local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb2);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ff8,"*",&local_ff9);
  local_ffb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ff8.regex,"\\*",&local_ffa);
  local_ffb = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,9);
  Language::Token::operator=(pvVar2,&local_ff8);
  Language::Token::~Token(&local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ffa);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1040,"+",&local_1041);
  local_1043 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1040.regex,"\\+",&local_1042);
  local_1043 = 0;
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,10);
  Language::Token::operator=(pvVar2,&local_1040);
  Language::Token::~Token(&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1042);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1088,"?",&local_1089);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1088.regex,"\\?",&local_108a);
  pvVar2 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&in_RDI->tokens,0xb);
  Language::Token::operator=(pvVar2,&local_1088);
  Language::Token::~Token(&local_1088);
  std::allocator<char>::~allocator((allocator<char> *)&local_108a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1089);
  return in_RDI;
}

Assistant:

Language build_language() {
  /* The top produtions were from the "grep.y" YACC grammar in the source
     code for Plan 9's grep utility, see here:
https://github.com/wangeguo/plan9/blob/master/sys/src/cmd/grep/grep.y
     The "set" related productions
     are from a grammar intended to be used by ProLog to parse Perl's regular
     expressions, see here:
http://www.cs.sfu.ca/~cameron/Teaching/384/99-3/regexp-plg.html */
  Language out;
  auto& prods = out.productions;
  prods.resize(NPRODS);
  prods[PROD_REGEX] = {"regex", {"union"}};
  prods[PROD_UNION_DECAY] = {"union", {"concat"}};
  prods[PROD_UNION] = {"union", {"union", "|", "concat"}};  // union
  prods[PROD_CONCAT_DECAY] = {"concat", {"qualified"}};
  prods[PROD_CONCAT] = {"concat", {"concat", "qualified"}};  // concatenation
  prods[PROD_QUAL_DECAY] = {"qualified", {"single"}};
  prods[PROD_STAR] = {"qualified", {"qualified", "*"}};
  prods[PROD_PLUS] = {"qualified", {"qualified", "+"}};
  prods[PROD_MAYBE] = {"qualified", {"qualified", "?"}};
  prods[PROD_SINGLE_CHAR] = {"single", {"char"}};
  prods[PROD_ANY] = {"single", {"."}};  // any
  prods[PROD_SINGLE_SET] = {"single", {"set"}};
  prods[PROD_PARENS_UNION] = {"single", {"(", "union", ")"}};
  prods[PROD_SET_POSITIVE] = {"set", {"positive-set"}};
  prods[PROD_SET_NEGATIVE] = {"set", {"negative-set"}};
  prods[PROD_POSITIVE_SET] = {"positive-set", {"[", "set-items", "]"}};
  prods[PROD_NEGATIVE_SET] = {"negative-set", {"[", "^", "set-items", "]"}};
  prods[PROD_SET_ITEMS_DECAY] = {"set-items", {"set-item"}};
  prods[PROD_SET_ITEMS_ADD] = {"set-items", {"set-items", "set-item"}};
  prods[PROD_SET_ITEM_CHAR] = {"set-item", {"char"}};
  prods[PROD_SET_ITEM_RANGE] = {"set-item", {"range"}};
  prods[PROD_RANGE] = {"range", {"char", "-", "char"}};
  out.tokens.resize(NTOKS);
  /* either one of the non-meta characters, or anything preceded by the escape
   * slash */
  out.tokens[TOK_CHAR] = {
      "char", "[^\\\\\\.\\[\\]\\(\\)\\|\\-\\^\\*\\+\\?]|\\\\."};
  out.tokens[TOK_DOT] = {".", "\\."};
  out.tokens[TOK_LRANGE] = {"[", "\\]"};
  out.tokens[TOK_RRANGE] = {"]", "\\]"};
  out.tokens[TOK_LPAREN] = {"(", "\\("};
  out.tokens[TOK_RPAREN] = {")", "\\)"};
  out.tokens[TOK_UNION] = {"|", "\\|"};
  out.tokens[TOK_RANGE] = {"-", "\\-"};
  out.tokens[TOK_NEGATE] = {"^", "\\^"};
  out.tokens[TOK_STAR] = {"*", "\\*"};
  out.tokens[TOK_PLUS] = {"+", "\\+"};
  out.tokens[TOK_MAYBE] = {"?", "\\?"};
  return out;
}